

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

double __thiscall
Problem_CGBG_FF::ComputeHouseProbability
          (Problem_CGBG_FF *this,Index houseI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  Index in_ESI;
  Problem_CGBG_FF *in_RDI;
  double dVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000020;
  Scope *in_stack_00000028;
  Index in_stack_00000034;
  double p_oVec_fl;
  Index fl;
  double p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  Index in_stack_ffffffffffffffac;
  Problem_CGBG_FF *in_stack_ffffffffffffffb0;
  uint local_44;
  double local_40;
  
  FilterObservationsForHouse
            ((Problem_CGBG_FF *)p_oVec_fl,in_stack_00000034,in_stack_00000028,in_stack_00000020);
  local_40 = 0.0;
  for (local_44 = 0; (ulong)local_44 < in_RDI->_m_nrFireLevels; local_44 = local_44 + 1) {
    in_stack_ffffffffffffff90 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         Likelihood(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                    (Index)((ulong)in_RDI >> 0x20));
    dVar1 = Prior(in_RDI,in_ESI,local_44);
    in_stack_ffffffffffffffb0 = (Problem_CGBG_FF *)((double)in_stack_ffffffffffffff90 * dVar1);
    local_40 = (double)in_stack_ffffffffffffffb0 + local_40;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff90);
  return local_40;
}

Assistant:

double Problem_CGBG_FF::ComputeHouseProbability(Index houseI,  
        const Scope& tupleOfAgents,
        const vector<Index>& types
        //const vector<Problem_CGBG_FF::observation_t>& oVec_hI
    ) const
{
#if DEBUGPROBS
    cout << "\tComputeHouseProbability for house "<<houseI
         << " tupleOfAgents=" << tupleOfAgents 
         << " types=" << PrintTools::SoftPrintVector(types)<<endl;
#endif
    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(houseI, tupleOfAgents, types);
#if DEBUGPROBS
    cout << "\tThe observation vector for this house is " << 
        PrintTools::SoftPrintVector(oVec_hI)<<endl;
#endif

    double p = 0.0;
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_oVec_fl = Likelihood(houseI, oVec_hI, fl) * Prior(houseI, fl);
#if DEBUGPROBS
        cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl << endl;
#endif
        p += p_oVec_fl;
    }
#if DEBUGPROBS
    cout << "P(oVec)="<< p << endl;
#endif
    return p;
}